

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hawktracer.cpp
# Opt level: O2

uintptr_t ht_feature_cached_string_add_mapping_
                    (HT_Timeline *timeline,HT_HashMap *map,uintptr_t hash,char *label)

{
  HT_Feature *pHVar1;
  HT_EventIdProvider *pHVar2;
  char *pcVar3;
  HT_ErrorCode error_code;
  HT_Event local_50;
  uintptr_t local_38;
  char *local_30;
  
  pHVar1 = timeline->features[(uint)HT_FeatureCachedString_get_class()::feature_klass._8_4_];
  if (pHVar1 != (HT_Feature *)0x0) {
    if (pHVar1[1].klass != (HT_FeatureKlass *)0x0) {
      ht_mutex_lock((HT_Mutex *)pHVar1[1].klass);
    }
    pcVar3 = ht_hash_map_insert(map,hash,label,&error_code);
    if ((pthread_mutex_t *)pHVar1[1].klass != (pthread_mutex_t *)0x0) {
      pthread_mutex_unlock((pthread_mutex_t *)pHVar1[1].klass);
    }
    if (error_code == HT_ERR_OK) {
      if (pcVar3 == (char *)0x0) {
        local_50.timestamp = std::chrono::_V2::steady_clock::now();
        pHVar2 = timeline->id_provider;
        LOCK();
        local_50.id = (pHVar2->current_identifier).super___atomic_base<unsigned_long>._M_i;
        (pHVar2->current_identifier).super___atomic_base<unsigned_long>._M_i =
             (pHVar2->current_identifier).super___atomic_base<unsigned_long>._M_i + 1;
        UNLOCK();
        local_50.klass = &ht_HT_StringMappingEvent_get_event_klass_instance::klass_instance;
        local_38 = hash;
        local_30 = label;
        ht_timeline_push_event(timeline,&local_50);
      }
    }
    else {
      hash = 0;
    }
    return hash;
  }
  __assert_fail("f",
                "/workspace/llm4binary/github/license_c_cmakelists/amzn[P]hawktracer/build_O2/hawktracer.cpp"
                ,0x953,
                "uintptr_t ht_feature_cached_string_add_mapping_(HT_Timeline *, HT_HashMap *, uintptr_t, const char *)"
               );
}

Assistant:

HT_Feature*
ht_timeline_get_feature(HT_Timeline* timeline, HT_FeatureKlass* feature_klass)
{
    return timeline->features[feature_klass->id];
}